

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::truncate
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export> *this,char *__file,
          __off_t __length)

{
  Export *pEVar1;
  Export *pEVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  ClientHook *pCVar3;
  Disposer *pDVar4;
  int in_EAX;
  uint uVar5;
  int extraout_EAX;
  Export *pEVar6;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    pEVar6 = pEVar2 + -1;
    this->pos = pEVar6;
    if (pEVar2[-1].vineInfo.ptr.ptr != (VineInfo *)0x0) {
      pEVar2[-1].vineInfo.ptr.ptr = (VineInfo *)0x0;
      uVar5 = (**(pEVar2[-1].vineInfo.ptr.disposer)->_vptr_Disposer)();
      pEVar6 = (Export *)(ulong)uVar5;
    }
    in_EAX = (int)pEVar6;
    if ((pEVar2[-1].resolveOp.ptr.isSet == true) &&
       (node = pEVar2[-1].resolveOp.ptr.field_1,
       node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      pEVar2[-1].resolveOp.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      in_EAX = extraout_EAX;
    }
    pCVar3 = pEVar2[-1].clientHook.ptr;
    if (pCVar3 != (ClientHook *)0x0) {
      pEVar2[-1].clientHook.ptr = (ClientHook *)0x0;
      pDVar4 = pEVar2[-1].clientHook.disposer;
      in_EAX = (**pDVar4->_vptr_Disposer)
                         (pDVar4,(_func_int *)
                                 ((long)&pCVar3->_vptr_ClientHook +
                                 (long)pCVar3->_vptr_ClientHook[-2]));
    }
    pEVar2 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }